

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_snode_check(lys_node *node,lyxp_node_type root_type,char *node_name,
                      lys_module *moveto_mod,int options)

{
  int iVar1;
  lys_module *plVar2;
  bool bVar3;
  lys_node *local_40;
  lys_node *parent;
  int options_local;
  lys_module *moveto_mod_local;
  char *node_name_local;
  lyxp_node_type root_type_local;
  lys_node *node_local;
  
  local_40 = lys_parent(node);
  while( true ) {
    bVar3 = false;
    if (local_40 != (lys_node *)0x0) {
      bVar3 = local_40->nodetype == LYS_USES;
    }
    if (!bVar3) break;
    local_40 = lys_parent(local_40);
  }
  if ((options & 0x20U) == 0) {
    if ((local_40 != (lys_node *)0x0) && (local_40->nodetype == LYS_OUTPUT)) {
      return -1;
    }
  }
  else if ((local_40 != (lys_node *)0x0) && (local_40->nodetype == LYS_INPUT)) {
    return -1;
  }
  if ((moveto_mod == (lys_module *)0x0) || (plVar2 = lys_node_module(node), plVar2 == moveto_mod)) {
    if ((root_type == LYXP_NODE_ROOT_CONFIG) && ((node->flags & 2) != 0)) {
      node_local._4_4_ = -1;
    }
    else if ((node->name == node_name) || (iVar1 = strcmp(node_name,"*"), iVar1 == 0)) {
      node_local._4_4_ = 0;
    }
    else {
      node_local._4_4_ = -1;
    }
  }
  else {
    node_local._4_4_ = -1;
  }
  return node_local._4_4_;
}

Assistant:

static int
moveto_snode_check(const struct lys_node *node, enum lyxp_node_type root_type, const char *node_name,
                   struct lys_module *moveto_mod, int options)
{
    struct lys_node *parent;

    /* RPC input/output check */
    for (parent = lys_parent(node); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
    if (options & LYXP_SNODE_OUTPUT) {
        if (parent && (parent->nodetype == LYS_INPUT)) {
            return -1;
        }
    } else {
        if (parent && (parent->nodetype == LYS_OUTPUT)) {
            return -1;
        }
    }

    /* module check */
    if (moveto_mod && (lys_node_module(node) != moveto_mod)) {
        return -1;
    }

    /* context check */
    if ((root_type == LYXP_NODE_ROOT_CONFIG) && (node->flags & LYS_CONFIG_R)) {
        return -1;
    }

    /* name check */
    if (!ly_strequal(node->name, node_name, 1) && strcmp(node_name, "*")) {
        return -1;
    }

    /* match */
    return EXIT_SUCCESS;
}